

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O1

transfers_state_t parse_transfer_state(char *value)

{
  int iVar1;
  transfers_state_t tVar2;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    tVar2 = TS_NOT_ALLOWED;
  }
  else {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      tVar2 = TS_ONCE;
    }
    else {
      iVar1 = strcmp(value,"2");
      if (iVar1 == 0) {
        tVar2 = TS_TWICE;
      }
      else {
        tVar2 = (uint)(*value == '\0') * 3;
      }
    }
  }
  return tVar2;
}

Assistant:

transfers_state_t parse_transfer_state(const char *value) {
    if (strcmp(value, "0") == 0)
        return TS_NOT_ALLOWED;
    else if (strcmp(value, "1") == 0)
        return TS_ONCE;
    else if (strcmp(value, "2") == 0)
        return TS_TWICE;
    else if (strcmp(value, "") == 0)
        return TS_UNLIMITED;
    else
        return TS_NOT_ALLOWED;
}